

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

bool __thiscall Func::IsStackArgsEnabled(Func *this)

{
  bool bVar1;
  JITTimeFunctionBody *this_00;
  Func *this_01;
  undefined1 local_2a;
  undefined1 local_29;
  Func *topFunc;
  bool isStackArgsEnabled;
  Func *curFunc;
  Func *this_local;
  
  this_00 = GetJITFunctionBody(this);
  bVar1 = JITTimeFunctionBody::UsesArgumentsObject(this_00);
  local_29 = false;
  if (bVar1) {
    local_29 = GetHasStackArgs(this);
  }
  topFunc._7_1_ = local_29;
  this_01 = GetTopFunc(this);
  if (this_01 != (Func *)0x0) {
    local_2a = false;
    if (local_29 != false) {
      local_2a = GetHasStackArgs(this_01);
    }
    topFunc._7_1_ = local_2a;
  }
  return topFunc._7_1_;
}

Assistant:

bool                IsStackArgsEnabled()
    {
                        Func* curFunc = this;
                        bool isStackArgsEnabled = GetJITFunctionBody()->UsesArgumentsObject() && curFunc->GetHasStackArgs();
                        Func * topFunc = curFunc->GetTopFunc();
                        if (topFunc != nullptr)
                        {
                            isStackArgsEnabled = isStackArgsEnabled && topFunc->GetHasStackArgs();
                        }
                        return isStackArgsEnabled;
    }